

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

uint anchorNameHash(ctmbstr s)

{
  uint uVar1;
  uint local_14;
  tmbchar c;
  ctmbstr ptStack_10;
  uint hashval;
  ctmbstr s_local;
  
  local_14 = 0;
  ptStack_10 = s;
  if (s != (ctmbstr)0x0) {
    for (; *ptStack_10 != '\0'; ptStack_10 = ptStack_10 + 1) {
      uVar1 = prvTidyToLower((int)*ptStack_10);
      local_14 = (int)(char)uVar1 + local_14 * 0x1f;
    }
  }
  return local_14 % 0x3fd;
}

Assistant:

static uint anchorNameHash(ctmbstr s)
{
    uint hashval = 0;
    /* Issue #149 - an inferred name can be null. avoid crash */
    if (s) 
    {
        for ( ; *s != '\0'; s++) {
            tmbchar c = TY_(ToLower)( *s );
            hashval = c + 31*hashval;
        }
    }
    return hashval % ANCHOR_HASH_SIZE;
}